

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_inverted_21(void)

{
  run("standalone tags should not require a newline to follow them",
      "^{{^boolean}}\n/\n  {{/boolean}}","{\"boolean\": false}",(char *)0x0,"^\n/\n");
  return;
}

Assistant:

static void
test_inverted_21(void)
{
    run(
        "standalone tags should not require a newline to follow them",
        "^{{^boolean}}\n/\n  {{/boolean}}",
        "{\"boolean\": false}",
        NULL,
        "^\n/\n"
    );
}